

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O0

void highbd_write_buffer_4xn_sse4_1
               (__m128i *in,uint16_t *output,int stride,int flipud,int height,int bd)

{
  __m128i res0;
  undefined1 auVar1 [16];
  int in_EDX;
  long in_RSI;
  int in_R8D;
  undefined8 extraout_XMM0_Qa;
  longlong extraout_XMM0_Qb;
  __m128i u;
  __m128i v;
  int i;
  int step;
  int j;
  undefined8 in_stack_ffffffffffffff78;
  longlong in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff98;
  int iVar2;
  
  for (iVar2 = 0; iVar2 < in_R8D; iVar2 = iVar2 + 1) {
    auVar1._4_4_ = iVar2;
    auVar1._0_4_ = in_stack_ffffffffffffff98;
    auVar1._8_8_ = 0;
    res0[1] = *(longlong *)(in_RSI + (long)(iVar2 * in_EDX) * 2);
    res0[0] = in_stack_ffffffffffffff80;
    highbd_get_recon_4xn_sse4_1
              ((__m128i)(auVar1 << 0x40),res0,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    *(undefined8 *)(in_RSI + (long)(iVar2 * in_EDX) * 2) = extraout_XMM0_Qa;
    in_stack_ffffffffffffff78 = extraout_XMM0_Qa;
    in_stack_ffffffffffffff80 = extraout_XMM0_Qb;
  }
  return;
}

Assistant:

static inline void highbd_write_buffer_4xn_sse4_1(__m128i *in, uint16_t *output,
                                                  int stride, int flipud,
                                                  int height, const int bd) {
  int j = flipud ? (height - 1) : 0;
  const int step = flipud ? -1 : 1;
  for (int i = 0; i < height; ++i, j += step) {
    __m128i v = _mm_loadl_epi64((__m128i const *)(output + i * stride));
    __m128i u = highbd_get_recon_4xn_sse4_1(v, in[j], bd);

    _mm_storel_epi64((__m128i *)(output + i * stride), u);
  }
}